

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_common.cpp
# Opt level: O0

RK_S32 axb_div_c(RK_S32 a,RK_S32 b,RK_S32 c)

{
  RK_U32 RVar1;
  byte bVar2;
  undefined4 local_28;
  RK_S32 tmp;
  RK_S32 sign;
  RK_U32 shift;
  RK_U32 right;
  RK_U32 left;
  RK_S32 c_local;
  RK_S32 b_local;
  RK_S32 a_local;
  
  sign = 0;
  local_28 = 1;
  if ((a == 0) || (b == 0)) {
    b_local = 0;
  }
  else if (((a * b) / b == a) && (c != 0)) {
    b_local = (a * b) / c;
  }
  else {
    c_local = a;
    if (a < 0) {
      local_28 = -1;
      c_local = -a;
    }
    left = b;
    if (b < 0) {
      local_28 = -local_28;
      left = -b;
    }
    RVar1 = left;
    right = c;
    if (c < 0) {
      local_28 = -local_28;
      right = -c;
    }
    if (right == 0) {
      b_local = local_28 * 0x7fffffff;
    }
    else {
      if (c_local < (int)left) {
        left = c_local;
        c_local = RVar1;
      }
      for (shift = 0x1f; (uint)(c_local << ((byte)shift & 0x1f)) >> ((byte)shift & 0x1f) != c_local;
          shift = shift - 1) {
      }
      for (; right < left >> ((byte)sign & 0x1f); sign = sign + 1) {
      }
      if (shift - 1 < (uint)sign) {
        b_local = local_28 * 0x7fffffff;
      }
      else {
        bVar2 = (char)(shift - 1) - (byte)sign;
        b_local = (((uint)(c_local << (bVar2 & 0x1f)) / right) * left >> (bVar2 & 0x1f)) * local_28;
      }
    }
  }
  return b_local;
}

Assistant:

RK_S32 axb_div_c(RK_S32 a, RK_S32 b, RK_S32 c)
{
    RK_U32 left = 32;
    RK_U32 right = 0;
    RK_U32 shift;
    RK_S32 sign = 1;
    RK_S32 tmp;

    if (a == 0 || b == 0)
        return 0;
    else if ((a * b / b) == a && c != 0)
        return (a * b / c);

    if (a < 0) {
        sign = -1;
        a = -a;
    }
    if (b < 0) {
        sign *= -1;
        b = -b;
    }
    if (c < 0) {
        sign *= -1;
        c = -c;
    }

    if (c == 0)
        return 0x7FFFFFFF * sign;

    if (b > a) {
        tmp = b;
        b = a;
        a = tmp;
    }

    for (--left; (((RK_U32)a << left) >> left) != (RK_U32)a; --left)
        ;

    left--;

    while (((RK_U32)b >> right) > (RK_U32)c)
        right++;

    if (right > left) {
        return 0x7FFFFFFF * sign;
    } else {
        shift = left - right;
        return (RK_S32)((((RK_U32)a << shift) /
                         (RK_U32)c * (RK_U32)b) >> shift) * sign;
    }
}